

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

timestamp_t duckdb::Timestamp::FromCString(char *str,idx_t len,optional_ptr<int,_true> nanos)

{
  TimestampCastResult TVar1;
  ConversionException *pCVar2;
  timestamp_t result;
  string local_70;
  string local_50;
  timestamp_t local_30;
  
  TVar1 = TryConvertTimestamp(str,len,&local_30,nanos,false);
  if (TVar1 == ERROR_INCORRECT_FORMAT) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,str,str + len);
    FormatError(&local_50,&local_70);
    ConversionException::ConversionException(pCVar2,&local_50);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (TVar1 != ERROR_RANGE) {
    if (TVar1 != ERROR_NON_UTC_TIMEZONE) {
      return (timestamp_t)local_30.value;
    }
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,str,str + len);
    UnsupportedTimezoneError(&local_50,&local_70);
    ConversionException::ConversionException(pCVar2,&local_50);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,str,str + len);
  RangeError(&local_50,&local_70);
  ConversionException::ConversionException(pCVar2,&local_50);
  __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t Timestamp::FromCString(const char *str, idx_t len, optional_ptr<int32_t> nanos) {
	timestamp_t result;
	switch (Timestamp::TryConvertTimestamp(str, len, result, nanos)) {
	case TimestampCastResult::SUCCESS:
	case TimestampCastResult::STRICT_UTC:
		break;
	case TimestampCastResult::ERROR_NON_UTC_TIMEZONE:
		throw ConversionException(UnsupportedTimezoneError(string(str, len)));
	case TimestampCastResult::ERROR_INCORRECT_FORMAT:
		throw ConversionException(FormatError(string(str, len)));
	case TimestampCastResult::ERROR_RANGE:
		throw ConversionException(RangeError(string(str, len)));
	}
	return result;
}